

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int math_randomseed(lua_State *L)

{
  int iVar1;
  RanState *state_00;
  lua_Unsigned n1_00;
  lua_Unsigned n2_00;
  lua_Integer n2;
  lua_Integer n1;
  RanState *state;
  lua_State *L_local;
  
  state_00 = (RanState *)lua_touserdata(L,-0xf4629);
  iVar1 = lua_type(L,1);
  if (iVar1 == -1) {
    randseed(L,state_00);
  }
  else {
    n1_00 = luaL_checkinteger(L,1);
    n2_00 = luaL_optinteger(L,2,0);
    setseed(L,(unsigned_long *)state_00,n1_00,n2_00);
  }
  return 2;
}

Assistant:

static int math_randomseed (lua_State *L) {
  RanState *state = (RanState *)lua_touserdata(L, lua_upvalueindex(1));
  if (lua_isnone(L, 1)) {
    randseed(L, state);
  }
  else {
    lua_Integer n1 = luaL_checkinteger(L, 1);
    lua_Integer n2 = luaL_optinteger(L, 2, 0);
    setseed(L, state->s, n1, n2);
  }
  return 2;  /* return seeds */
}